

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attribute.cpp
# Opt level: O2

void __thiscall
glslang::TParseContext::handleSwitchAttributes
          (TParseContext *this,TAttributes *attributes,TIntermNode *node)

{
  TAttributeType TVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined8 uVar4;
  undefined4 extraout_var_01;
  char *pcVar5;
  _func_int **pp_Var6;
  _List_node_header *p_Var7;
  _List_node_base *p_Var8;
  long lVar3;
  undefined4 extraout_var_00;
  
  iVar2 = (*node->_vptr_TIntermNode[10])(node);
  lVar3 = CONCAT44(extraout_var,iVar2);
  if (lVar3 != 0) {
    p_Var7 = &(attributes->
              super_list<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>
              ).
              super__List_base<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>
              ._M_impl._M_node;
    p_Var8 = &p_Var7->super__List_node_base;
    while (p_Var8 = ((_List_node_base *)&p_Var8->_M_next)->_M_next,
          (_List_node_header *)p_Var8 != p_Var7) {
      iVar2 = TAttributeArgs::size((TAttributeArgs *)(p_Var8 + 1));
      if (iVar2 < 1) {
        TVar1 = *(TAttributeType *)&p_Var8[1]._M_next;
        if (TVar1 == EatBranch) {
          *(undefined1 *)(lVar3 + 0x31) = 1;
        }
        else {
          if (TVar1 != EatFlatten) {
            iVar2 = (**node->_vptr_TIntermNode)(node);
            uVar4 = CONCAT44(extraout_var_01,iVar2);
            pp_Var6 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
            pcVar5 = "attribute does not apply to a switch";
            goto LAB_003e18fc;
          }
          *(undefined1 *)(lVar3 + 0x30) = 1;
        }
      }
      else {
        iVar2 = (**node->_vptr_TIntermNode)(node);
        uVar4 = CONCAT44(extraout_var_00,iVar2);
        pp_Var6 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
        pcVar5 = "attribute with arguments not recognized, skipping";
LAB_003e18fc:
        (*pp_Var6[0x2e])(this,uVar4,pcVar5,"","");
      }
    }
  }
  return;
}

Assistant:

void TParseContext::handleSwitchAttributes(const TAttributes& attributes, TIntermNode* node)
{
    TIntermSwitch* selection = node->getAsSwitchNode();
    if (selection == nullptr)
        return;

    for (auto it = attributes.begin(); it != attributes.end(); ++it) {
        if (it->size() > 0) {
            warn(node->getLoc(), "attribute with arguments not recognized, skipping", "", "");
            continue;
        }

        switch (it->name) {
        case EatFlatten:
            selection->setFlatten();
            break;
        case EatBranch:
            selection->setDontFlatten();
            break;
        default:
            warn(node->getLoc(), "attribute does not apply to a switch", "", "");
            break;
        }
    }
}